

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DiscreteQuantileFunction::Deserialize
          (DiscreteQuantileFunction *this,Deserializer *deserializer,AggregateFunction *function)

{
  pointer pFVar1;
  reference type;
  pointer *__ptr;
  AggregateFunction local_148;
  
  QuantileBindData::Deserialize((Deserializer *)this,(AggregateFunction *)deserializer);
  pFVar1 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)this);
  type = vector<duckdb::LogicalType,_true>::operator[]
                   (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData == 0x68) {
    GetAggregate(&local_148,type);
    AggregateFunction::operator=(function,&local_148);
  }
  else {
    DiscreteQuantileListFunction::GetAggregate(&local_148,type);
    AggregateFunction::operator=(function,&local_148);
  }
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02433f70;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);
		auto &quantile_data = bind_data->Cast<QuantileBindData>();

		auto &input_type = function.arguments[0];
		if (quantile_data.quantiles.size() == 1) {
			function = GetAggregate(input_type);
		} else {
			function = DiscreteQuantileListFunction::GetAggregate(input_type);
		}
		return bind_data;
	}